

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

LClosure * luaF_newLclosure(lua_State *L,int n)

{
  LClosure *pLVar1;
  
  pLVar1 = (LClosure *)luaC_newobj(L,6,(long)(n * 8 + 0x20));
  pLVar1->p = (Proto *)0x0;
  pLVar1->nupvalues = (lu_byte)n;
  if (n != 0) {
    memset((void *)((long)pLVar1 + (long)(int)(n - 1U) * 8 + (ulong)(n - 1U) * -8 + 0x20),0,
           (ulong)(uint)n << 3);
  }
  return pLVar1;
}

Assistant:

LClosure *luaF_newLclosure(lua_State *L, int n) {
    GCObject *o = luaC_newobj(L, LUA_TLCL, sizeLclosure(n));
    LClosure *c = gco2lcl(o);
    c->p = NULL;
    c->nupvalues = cast_byte(n);
    while (n--) c->upvals[n] = NULL;
    return c;
}